

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexTriangleKernel.cpp
# Opt level: O1

void Ptex::v2_4::(anonymous_namespace)::Apply<Ptex::v2_4::PtexHalf,4>
               (PtexTriangleKernelIter *k,float *result,void *data,int param_4,int param_5)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  int iVar5;
  ushort *puVar6;
  int iVar7;
  ushort *puVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  iVar7 = k->v1;
  if (iVar7 != k->v2) {
    fVar1 = k->A;
    do {
      iVar5 = k->rowlen - iVar7;
      iVar4 = iVar5 - k->w2;
      if (iVar4 < k->u1) {
        iVar4 = k->u1;
      }
      iVar5 = iVar5 - k->w1;
      if (k->u2 < iVar5) {
        iVar5 = k->u2;
      }
      if (0 < iVar5 - iVar4) {
        puVar8 = (ushort *)((long)data + (long)((k->rowlen * iVar7 + iVar4) * 4) * 2);
        puVar6 = puVar8 + (iVar5 - iVar4) * 4;
        fVar11 = (float)iVar4 - k->u;
        fVar10 = (float)iVar7 - k->v;
        fVar12 = fVar11 * k->A * fVar11 + (k->B * fVar11 + k->C * fVar10) * fVar10;
        fVar10 = (fVar11 + fVar11 + 1.0) * k->A + fVar10 * k->B;
        do {
          if (fVar12 < 1.0) {
            fVar9 = expf(fVar12 * -6.125);
            fVar9 = fVar9 * k->wscale;
            k->weight = k->weight + fVar9;
            fVar11 = *(float *)(PtexHalf::h2fTable + (ulong)puVar8[3] * 4);
            fVar2 = *(float *)(PtexHalf::h2fTable + (ulong)puVar8[2] * 4);
            fVar3 = *(float *)(PtexHalf::h2fTable + (ulong)puVar8[1] * 4);
            *result = fVar9 * *(float *)(PtexHalf::h2fTable + (ulong)*puVar8 * 4) + *result;
            result[1] = fVar9 * fVar3 + result[1];
            result[2] = fVar9 * fVar2 + result[2];
            result[3] = fVar9 * fVar11 + result[3];
          }
          fVar12 = fVar12 + fVar10;
          fVar10 = fVar10 + fVar1 + fVar1;
          puVar8 = puVar8 + 4;
        } while (puVar8 < puVar6);
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 != k->v2);
  }
  return;
}

Assistant:

void Apply(PtexTriangleKernelIter& k, float* result, void* data, int /*nChan*/, int /*nTxChan*/)
    {
        int nTxChan = nChan;
        float DDQ = 2.0f*k.A;
        for (int vi = k.v1; vi != k.v2; vi++) {
            int xw = k.rowlen - vi;
            int x1 = PtexUtils::max(k.u1, xw-k.w2);
            int x2 = PtexUtils::min(k.u2, xw-k.w1);
            float U = (float)x1 - k.u;
            float V = (float)vi - k.v;
            float DQ = k.A*(2.0f*U+1.0f)+k.B*V;
            float Q = k.A*U*U + (k.B*U + k.C*V)*V;
            T* p = static_cast<T*>(data) + (vi * k.rowlen + x1) * nTxChan;
            T* pEnd = p + (x2-x1)*nTxChan;
            for (; p < pEnd; p += nTxChan) {
                if (Q < 1.0f) {
                    float weight = gaussian(Q)*k.wscale;
                    k.weight += weight;
                    PtexUtils::VecAccum<T,nChan>()(result, p, weight);
                }
                Q += DQ;
                DQ += DDQ;
            }
        }
    }